

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Array2D<float> * __thiscall
pbrt::Sample2DFunction
          (Array2D<float> *__return_storage_ptr__,pbrt *this,function<float_(float,_float)> *f,
          int nu,int nv,int nSamples,Bounds2f domain,Allocator alloc)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  pointer pPVar7;
  pointer pPVar8;
  uint uVar9;
  ulong uVar10;
  undefined4 in_register_0000008c;
  Allocator allocator;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  float fVar17;
  undefined8 in_XMM0_Qb;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  float fVar21;
  undefined8 in_XMM1_Qb;
  undefined1 auVar22 [16];
  undefined4 in_XMM7_Da;
  undefined1 in_register_000013c4 [12];
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> samples;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_c0;
  int local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  undefined4 local_94;
  Bounds2i local_90;
  ulong local_80;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  allocator.memoryResource._4_4_ = in_register_0000008c;
  allocator.memoryResource._0_4_ = nSamples;
  uVar9 = (uint)f;
  local_68 = domain.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_64 = domain.pMax.super_Tuple2<pbrt::Point2,_float>.y;
  local_78 = domain.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_74 = domain.pMin.super_Tuple2<pbrt::Point2,_float>.y;
  uStack_70 = in_XMM0_Qb;
  uStack_60 = in_XMM1_Qb;
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
            (&local_c0,(long)nv,(allocator_type *)&local_90);
  if (0 < nv) {
    uVar11 = 0;
    do {
      if (uVar11 == 0) {
        fVar17 = 0.0;
        auVar16 = ZEXT816(0) << 0x40;
      }
      else {
        fVar17 = 1.0;
        lVar12 = 0;
        uVar10 = uVar11;
        do {
          fVar17 = fVar17 * 0.5;
          lVar12 = (lVar12 - uVar10 / 2) * 2 + uVar10;
          bVar15 = 1 < uVar10;
          uVar10 = uVar10 / 2;
        } while (bVar15);
        auVar16._4_12_ = in_register_000013c4;
        auVar16._0_4_ = in_XMM7_Da;
        auVar16 = vcvtusi2ss_avx512f(auVar16,lVar12);
        lVar12 = 0;
        fVar21 = 1.0;
        uVar10 = uVar11;
        do {
          fVar21 = fVar21 * 0.33333334;
          lVar12 = (lVar12 - uVar10 / 3) * 3 + uVar10;
          bVar15 = 2 < uVar10;
          uVar10 = uVar10 / 3;
        } while (bVar15);
        auVar2._4_12_ = in_register_000013c4;
        auVar2._0_4_ = in_XMM7_Da;
        auVar2 = vcvtusi2ss_avx512f(auVar2,lVar12);
        auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar17 * auVar16._0_4_)))
        ;
        fVar17 = auVar16._0_4_;
        auVar16 = ZEXT416((uint)(fVar21 * auVar2._0_4_));
      }
      auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar16);
      local_c0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar11].super_Tuple2<pbrt::Point2,_float>.x = fVar17;
      local_c0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar11].super_Tuple2<pbrt::Point2,_float>.y =
           auVar16._0_4_;
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)nv);
  }
  local_90.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
  local_90.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0x3f800000;
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_c0,
             (Point2<float> *)&local_90);
  local_90.pMin.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_c0,
             (Point2<float> *)&local_90);
  auVar18._8_4_ = 0x3f800000;
  auVar18._0_8_ = 0x3f8000003f800000;
  auVar18._12_4_ = 0x3f800000;
  local_90.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)vmovlps_avx(auVar18);
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_c0,
             (Point2<float> *)&local_90);
  local_90.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar9 >> 0x1f & uVar9;
  local_90.pMin.super_Tuple2<pbrt::Point2,_int>.y = nu >> 0x1f & nu;
  uVar11 = 0;
  uVar10 = 0;
  if (0 < (int)uVar9) {
    uVar10 = (ulong)f & 0xffffffff;
  }
  if (0 < nu) {
    uVar11 = (ulong)(uint)nu;
  }
  local_90.pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)(uVar10 | uVar11 << 0x20);
  Array2D<float>::Array2D(__return_storage_ptr__,&local_90,allocator);
  if (0 < nu) {
    local_a0 = (float)(int)uVar9;
    auVar4._4_4_ = fStack_74;
    auVar4._0_4_ = local_78;
    auVar4._8_8_ = uStack_70;
    local_48 = vmovshdup_avx(auVar4);
    auVar5._4_4_ = fStack_64;
    auVar5._0_4_ = local_68;
    auVar5._8_8_ = uStack_60;
    local_58 = vmovshdup_avx(auVar5);
    iVar6 = 0;
    local_a4 = (float)nu;
    local_a8 = nu;
    do {
      if (0 < (int)uVar9) {
        local_9c = (float)iVar6;
        pPVar7 = local_c0.
                 super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pPVar8 = local_c0.
                 super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar13 = 0;
        do {
          if (pPVar8 == pPVar7) {
            fVar17 = 0.0;
            pPVar8 = pPVar7;
          }
          else {
            local_98 = (float)(int)uVar13;
            uVar11 = 0;
            auVar16 = ZEXT816(0);
            do {
              local_80 = auVar16._0_8_;
              fVar17 = (local_98 + pPVar7[uVar11].super_Tuple2<pbrt::Point2,_float>.x) / local_a0;
              fVar21 = (local_9c + pPVar7[uVar11].super_Tuple2<pbrt::Point2,_float>.y) / local_a4;
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * local_68)),
                                        ZEXT416((uint)(1.0 - fVar17)),ZEXT416((uint)local_78));
              auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * (float)local_58._0_4_)),
                                       ZEXT416((uint)(1.0 - fVar21)),ZEXT416((uint)local_48._0_4_));
              local_90.pMin.super_Tuple2<pbrt::Point2,_int>.x = auVar16._0_4_;
              local_94 = auVar2._0_4_;
              if (*(long *)(this + 0x10) == 0) {
                std::__throw_bad_function_call();
              }
              auVar20._0_8_ = (**(code **)(this + 0x18))(this,&local_90,&local_94);
              auVar20._8_56_ = extraout_var;
              auVar3._8_4_ = 0x7fffffff;
              auVar3._0_8_ = 0x7fffffff7fffffff;
              auVar3._12_4_ = 0x7fffffff;
              auVar16 = vandps_avx512vl(auVar20._0_16_,auVar3);
              auVar22._8_8_ = 0;
              auVar22._0_8_ = local_80;
              uVar11 = uVar11 + 1;
              auVar19._0_8_ = (double)auVar16._0_4_;
              auVar19._8_8_ = auVar16._8_8_;
              auVar16 = vmaxsd_avx(auVar19,auVar22);
              pPVar7 = local_c0.
                       super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar11 < (ulong)((long)local_c0.
                                            super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_c0.
                                            super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
            fVar17 = (float)auVar16._0_8_;
            pPVar8 = local_c0.
                     super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          iVar1 = (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
          uVar14 = uVar13 + 1;
          __return_storage_ptr__->values
          [(int)(((__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar1) *
                 (iVar6 - (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y) +
                (uVar13 - iVar1))] = fVar17;
          uVar13 = uVar14;
        } while (uVar14 != uVar9);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != local_a8);
  }
  if (local_c0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<Float> Sample2DFunction(std::function<Float(Float, Float)> f, int nu, int nv,
                                int nSamples, Bounds2f domain, Allocator alloc) {
    std::vector<Point2f> samples(nSamples);
    for (int i = 0; i < nSamples; ++i)
        samples[i] = Point2f(RadicalInverse(0, i), RadicalInverse(1, i));
    // Check the corners, too.
    samples.push_back(Point2f(0, 1));
    samples.push_back(Point2f(1, 0));
    samples.push_back(Point2f(1, 1));

    Array2D<Float> values(nu, nv, alloc);
    for (int v = 0; v < nv; ++v) {
        for (int u = 0; u < nu; ++u) {
            double accum = 0;
            for (size_t i = 0; i < samples.size(); ++i) {
                Point2f p = domain.Lerp(
                    Point2f((u + samples[i][0]) / nu, (v + samples[i][1]) / nv));
                Float fuv = std::abs(f(p.x, p.y));
                accum = std::max<double>(accum, fuv);
            }
            // There's actually no need for the divide by nSamples, since
            // these are normalzed into a PDF anyway.
            values(u, v) = accum;
        }
    }

    return values;
}